

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::CordFieldGenerator::
GenerateMemberConstexprConstructor(CordFieldGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  Sub *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_151;
  char *local_150 [3];
  allocator<char> local_131;
  string local_130;
  Sub *local_110;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  Printer *p_local;
  CordFieldGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  FieldDescriptor::default_value_string_abi_cxx11_((this->super_FieldGeneratorBase).field_);
  uVar3 = std::__cxx11::string::empty();
  uVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    local_151 = 1;
    local_110 = &local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Split",&local_131);
    bVar2 = ShouldSplit((this->super_FieldGeneratorBase).field_,
                        (this->super_FieldGeneratorBase).options_);
    local_150[0] = "";
    if (bVar2) {
      local_150[0] = "Split::";
    }
    io::Printer::Sub::Sub<char_const*>(&local_108,&local_130,local_150);
    local_151 = 0;
    local_50 = &local_108;
    local_48 = 1;
    v._M_len = 1;
    v._M_array = local_50;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_168,
               "$name$_{::absl::strings_internal::MakeStringConstant($classname$::Impl_::$Split$_default_$name$_func_{})}"
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (uVar1,local_40._M_allocated_capacity,local_40._8_8_,local_168._M_len,local_168._M_str
              );
    local_1a0 = (Sub *)&local_50;
    do {
      local_1a0 = local_1a0 + -1;
      io::Printer::Sub::~Sub(local_1a0);
    } while (local_1a0 != &local_108);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"$name$_{}");
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar1,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (field_->default_value_string().empty()) {
      p->Emit("$name$_{}");
    } else {
      p->Emit({{"Split", ShouldSplit(field_, options_) ? "Split::" : ""}},
              "$name$_{::absl::strings_internal::MakeStringConstant("
              "$classname$::Impl_::$Split$_default_$name$_func_{})}");
    }
  }